

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_notifications.cpp
# Opt level: O3

InterruptResult * __thiscall
node::KernelNotifications::blockTip
          (InterruptResult *__return_storage_ptr__,KernelNotifications *this,
          SynchronizationState state,CBlockIndex *index)

{
  long lVar1;
  uint256 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  undefined4 in_register_00000014;
  CBlockIndex *i;
  InterruptResult *pIVar7;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock3;
  
  i = (CBlockIndex *)CONCAT44(in_register_00000014,state);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  criticalblock3.super_unique_lock._M_device = (mutex_type *)(__return_storage_ptr__ + 8);
  criticalblock3.super_unique_lock._M_owns = false;
  std::unique_lock<std::mutex>::lock(&criticalblock3.super_unique_lock);
  puVar2 = i->phashBlock;
  if (puVar2 == (uint256 *)0x0) {
    __assert_fail("phashBlock != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                  ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
  }
  uVar3 = *(undefined8 *)(puVar2->super_base_blob<256U>).m_data._M_elems;
  uVar4 = *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 8);
  uVar5 = *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x18);
  *(undefined8 *)(__return_storage_ptr__ + 0x3c) =
       *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x10);
  *(undefined8 *)(__return_storage_ptr__ + 0x40) = uVar5;
  *(undefined8 *)(__return_storage_ptr__ + 0x34) = uVar3;
  *(undefined8 *)(__return_storage_ptr__ + 0x38) = uVar4;
  std::condition_variable::notify_all();
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock3.super_unique_lock);
  CClientUIInterface::NotifyBlockTip
            ((CClientUIInterface *)&uiInterface,(SynchronizationState)this,i);
  pIVar7 = (InterruptResult *)0x0;
  if ((*(int *)(__return_storage_ptr__ + 4) != 0) &&
     (*(int *)(__return_storage_ptr__ + 4) <= i->nHeight)) {
    bVar6 = util::SignalInterrupt::operator()(*(SignalInterrupt **)(__return_storage_ptr__ + 0x44));
    pIVar7 = (InterruptResult *)0x100;
    if (!bVar6) {
      logging_function._M_str = "blockTip";
      logging_function._M_len = 8;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/kernel_notifications.cpp"
      ;
      source_file._M_len = 0x6d;
      LogPrintFormatInternal<>
                (logging_function,source_file,0x3e,ALL,Error,(ConstevalFormatString<0U>)0x7f0fad);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pIVar7;
  }
  __stack_chk_fail();
}

Assistant:

kernel::InterruptResult KernelNotifications::blockTip(SynchronizationState state, CBlockIndex& index)
{
    {
        LOCK(m_tip_block_mutex);
        m_tip_block = index.GetBlockHash();
        m_tip_block_cv.notify_all();
    }

    uiInterface.NotifyBlockTip(state, &index);
    if (m_stop_at_height && index.nHeight >= m_stop_at_height) {
        if (!m_shutdown()) {
            LogError("Failed to send shutdown signal after reaching stop height\n");
        }
        return kernel::Interrupted{};
    }
    return {};
}